

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_tcp.cpp
# Opt level: O2

string * __thiscall
miniros::TransportTCP::getClientURI_abi_cxx11_(string *__return_storage_ptr__,TransportTCP *this)

{
  char *__src;
  ostream *poVar1;
  ushort uVar2;
  socklen_t sas_len;
  string ip;
  char namebuf [128];
  sockaddr_storage sas;
  stringstream uri;
  ostream local_190 [376];
  
  sas_len = 0x80;
  getpeername(this->sock_,(sockaddr *)&sas,&sas_len);
  namebuf[0x70] = '\0';
  namebuf[0x71] = '\0';
  namebuf[0x72] = '\0';
  namebuf[0x73] = '\0';
  namebuf[0x74] = '\0';
  namebuf[0x75] = '\0';
  namebuf[0x76] = '\0';
  namebuf[0x77] = '\0';
  namebuf[0x78] = '\0';
  namebuf[0x79] = '\0';
  namebuf[0x7a] = '\0';
  namebuf[0x7b] = '\0';
  namebuf[0x7c] = '\0';
  namebuf[0x7d] = '\0';
  namebuf[0x7e] = '\0';
  namebuf[0x7f] = '\0';
  namebuf[0x60] = '\0';
  namebuf[0x61] = '\0';
  namebuf[0x62] = '\0';
  namebuf[99] = '\0';
  namebuf[100] = '\0';
  namebuf[0x65] = '\0';
  namebuf[0x66] = '\0';
  namebuf[0x67] = '\0';
  namebuf[0x68] = '\0';
  namebuf[0x69] = '\0';
  namebuf[0x6a] = '\0';
  namebuf[0x6b] = '\0';
  namebuf[0x6c] = '\0';
  namebuf[0x6d] = '\0';
  namebuf[0x6e] = '\0';
  namebuf[0x6f] = '\0';
  namebuf[0x50] = '\0';
  namebuf[0x51] = '\0';
  namebuf[0x52] = '\0';
  namebuf[0x53] = '\0';
  namebuf[0x54] = '\0';
  namebuf[0x55] = '\0';
  namebuf[0x56] = '\0';
  namebuf[0x57] = '\0';
  namebuf[0x58] = '\0';
  namebuf[0x59] = '\0';
  namebuf[0x5a] = '\0';
  namebuf[0x5b] = '\0';
  namebuf[0x5c] = '\0';
  namebuf[0x5d] = '\0';
  namebuf[0x5e] = '\0';
  namebuf[0x5f] = '\0';
  namebuf[0x40] = '\0';
  namebuf[0x41] = '\0';
  namebuf[0x42] = '\0';
  namebuf[0x43] = '\0';
  namebuf[0x44] = '\0';
  namebuf[0x45] = '\0';
  namebuf[0x46] = '\0';
  namebuf[0x47] = '\0';
  namebuf[0x48] = '\0';
  namebuf[0x49] = '\0';
  namebuf[0x4a] = '\0';
  namebuf[0x4b] = '\0';
  namebuf[0x4c] = '\0';
  namebuf[0x4d] = '\0';
  namebuf[0x4e] = '\0';
  namebuf[0x4f] = '\0';
  namebuf[0x30] = '\0';
  namebuf[0x31] = '\0';
  namebuf[0x32] = '\0';
  namebuf[0x33] = '\0';
  namebuf[0x34] = '\0';
  namebuf[0x35] = '\0';
  namebuf[0x36] = '\0';
  namebuf[0x37] = '\0';
  namebuf[0x38] = '\0';
  namebuf[0x39] = '\0';
  namebuf[0x3a] = '\0';
  namebuf[0x3b] = '\0';
  namebuf[0x3c] = '\0';
  namebuf[0x3d] = '\0';
  namebuf[0x3e] = '\0';
  namebuf[0x3f] = '\0';
  namebuf[0x20] = '\0';
  namebuf[0x21] = '\0';
  namebuf[0x22] = '\0';
  namebuf[0x23] = '\0';
  namebuf[0x24] = '\0';
  namebuf[0x25] = '\0';
  namebuf[0x26] = '\0';
  namebuf[0x27] = '\0';
  namebuf[0x28] = '\0';
  namebuf[0x29] = '\0';
  namebuf[0x2a] = '\0';
  namebuf[0x2b] = '\0';
  namebuf[0x2c] = '\0';
  namebuf[0x2d] = '\0';
  namebuf[0x2e] = '\0';
  namebuf[0x2f] = '\0';
  namebuf[0x10] = '\0';
  namebuf[0x11] = '\0';
  namebuf[0x12] = '\0';
  namebuf[0x13] = '\0';
  namebuf[0x14] = '\0';
  namebuf[0x15] = '\0';
  namebuf[0x16] = '\0';
  namebuf[0x17] = '\0';
  namebuf[0x18] = '\0';
  namebuf[0x19] = '\0';
  namebuf[0x1a] = '\0';
  namebuf[0x1b] = '\0';
  namebuf[0x1c] = '\0';
  namebuf[0x1d] = '\0';
  namebuf[0x1e] = '\0';
  namebuf[0x1f] = '\0';
  namebuf[0] = '\0';
  namebuf[1] = '\0';
  namebuf[2] = '\0';
  namebuf[3] = '\0';
  namebuf[4] = '\0';
  namebuf[5] = '\0';
  namebuf[6] = '\0';
  namebuf[7] = '\0';
  namebuf[8] = '\0';
  namebuf[9] = '\0';
  namebuf[10] = '\0';
  namebuf[0xb] = '\0';
  namebuf[0xc] = '\0';
  namebuf[0xd] = '\0';
  namebuf[0xe] = '\0';
  namebuf[0xf] = '\0';
  if (sas.ss_family == 10) {
    uVar2 = sas.__ss_padding._0_2_ << 8 | (ushort)sas.__ss_padding._0_2_ >> 8;
    inet_ntop(10,sas.__ss_padding + 6,namebuf,0x80);
  }
  else if (sas.ss_family == 2) {
    uVar2 = sas.__ss_padding._0_2_ << 8 | (ushort)sas.__ss_padding._0_2_ >> 8;
    __src = inet_ntoa((in_addr)sas.__ss_padding._2_4_);
    strncpy(namebuf,__src,0x7f);
  }
  else {
    uVar2 = 0;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&ip,namebuf,(allocator<char> *)&uri);
  std::__cxx11::stringstream::stringstream((stringstream *)&uri);
  poVar1 = std::operator<<(local_190,(string *)&ip);
  poVar1 = std::operator<<(poVar1,":");
  std::ostream::operator<<((ostream *)poVar1,(uint)uVar2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&uri);
  std::__cxx11::string::~string((string *)&ip);
  return __return_storage_ptr__;
}

Assistant:

std::string TransportTCP::getClientURI()
{
  MINIROS_ASSERT(!is_server_);

  sockaddr_storage sas;
  socklen_t sas_len = sizeof(sas);
  getpeername(sock_, (sockaddr *)&sas, &sas_len);
  
  sockaddr_in *sin = (sockaddr_in *)&sas;
  sockaddr_in6 *sin6 = (sockaddr_in6 *)&sas;

  char namebuf[128] = {};
  int port;

  switch (sas.ss_family)
  {
    case AF_INET:
      port = ntohs(sin->sin_port);
      strncpy(namebuf, inet_ntoa(sin->sin_addr), sizeof(namebuf)-1);
      break;
    case AF_INET6:
      port = ntohs(sin6->sin6_port);
      inet_ntop(AF_INET6, (void*)&(sin6->sin6_addr), namebuf, sizeof(namebuf));
      break;
    default:
      namebuf[0] = 0;
      port = 0;
      break;
  }

  std::string ip = namebuf;
  std::stringstream uri;
  uri << ip << ":" << port;

  return uri.str();
}